

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_clip_bary4(REF_DBL *orig_bary,REF_DBL *bary)

{
  int iVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  
  dVar13 = *orig_bary;
  if ((ulong)ABS(dVar13) < 0x7ff0000000000000) {
    if ((ulong)ABS(orig_bary[1]) < 0x7ff0000000000000) {
      if ((ulong)ABS(orig_bary[2]) < 0x7ff0000000000000) {
        if ((ulong)ABS(orig_bary[3]) < 0x7ff0000000000000) {
          dVar9 = 0.0;
          if (0.0 <= dVar13) {
            dVar9 = dVar13;
          }
          *bary = dVar9;
          dVar13 = 0.0;
          if (0.0 <= orig_bary[1]) {
            dVar13 = orig_bary[1];
          }
          bary[1] = dVar13;
          dVar7 = 0.0;
          if (0.0 <= orig_bary[2]) {
            dVar7 = orig_bary[2];
          }
          bary[2] = dVar7;
          dVar12 = 0.0;
          if (0.0 <= orig_bary[3]) {
            dVar12 = orig_bary[3];
          }
          bary[3] = dVar12;
          auVar6._0_8_ = dVar9 + dVar13 + dVar7 + dVar12;
          auVar11._0_8_ = auVar6._0_8_ * 1e+20;
          auVar11._8_8_ = dVar9;
          auVar15._8_8_ = -dVar9;
          auVar15._0_8_ = -auVar11._0_8_;
          auVar15 = maxpd(auVar11,auVar15);
          dVar14 = auVar15._0_8_;
          if (auVar15._8_8_ < dVar14) {
            dVar16 = dVar13;
            if (dVar13 <= -dVar13) {
              dVar16 = -dVar13;
            }
            if (dVar16 < dVar14) {
              dVar16 = dVar7;
              if (dVar7 <= -dVar7) {
                dVar16 = -dVar7;
              }
              if (dVar16 < dVar14) {
                dVar16 = dVar12;
                if (dVar12 <= -dVar12) {
                  dVar16 = -dVar12;
                }
                if (dVar16 < dVar14) {
                  auVar10._8_8_ = dVar13;
                  auVar10._0_8_ = dVar9;
                  auVar6._8_8_ = auVar6._0_8_;
                  auVar11 = divpd(auVar10,auVar6);
                  *(undefined1 (*) [16])bary = auVar11;
                  auVar8._8_8_ = dVar12;
                  auVar8._0_8_ = dVar7;
                  auVar15 = divpd(auVar8,auVar6);
                  *(undefined1 (*) [16])(bary + 2) = auVar15;
                  if (0.0 <= auVar11._0_8_) {
                    if (0.0 <= auVar11._8_8_) {
                      if (0.0 <= auVar15._0_8_) {
                        if (0.0 <= auVar15._8_8_) {
                          if ((ulong)ABS(auVar11._0_8_) < 0x7ff0000000000000) {
                            if ((ulong)ABS(auVar11._8_8_) < 0x7ff0000000000000) {
                              if ((ulong)ABS(auVar15._0_8_) < 0x7ff0000000000000) {
                                if ((ulong)ABS(auVar15._8_8_) < 0x7ff0000000000000) {
                                  return 0;
                                }
                                pcVar5 = "bary[3] not finite";
                                uVar4 = 0xbaf;
                              }
                              else {
                                pcVar5 = "bary[2] not finite";
                                uVar4 = 0xbae;
                              }
                            }
                            else {
                              pcVar5 = "bary[1] not finite";
                              uVar4 = 0xbad;
                            }
                          }
                          else {
                            pcVar5 = "bary[0] not finite";
                            uVar4 = 0xbac;
                          }
                        }
                        else {
                          pcVar5 = "bary[3] not positive";
                          uVar4 = 0xbaa;
                        }
                      }
                      else {
                        pcVar5 = "bary[2] not positive";
                        uVar4 = 0xba9;
                      }
                    }
                    else {
                      pcVar5 = "bary[1] not positive";
                      uVar4 = 0xba8;
                    }
                  }
                  else {
                    pcVar5 = "bary[0] not positive";
                    uVar4 = 0xba7;
                  }
                  goto LAB_00196442;
                }
              }
            }
          }
          printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",auVar6._0_8_,
                 *orig_bary,orig_bary[1],orig_bary[2],orig_bary[3],
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xb98);
          printf("clipped bary\n%.18e %.18e\n%.18e %.18e\n",*bary,bary[1],bary[2],bary[3]);
          iVar3 = 0;
          lVar2 = 1;
          do {
            iVar1 = (int)lVar2;
            if (bary[lVar2] < bary[iVar3] || bary[lVar2] == bary[iVar3]) {
              iVar1 = iVar3;
            }
            iVar3 = iVar1;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          bary[2] = 0.0;
          bary[3] = 0.0;
          *bary = 0.0;
          bary[1] = 0.0;
          bary[iVar3] = 1.0;
          printf("modified bary\n%.18e %.18e\n%.18e %.18e\n",*bary,bary[1],bary[2],bary[3]);
          return 4;
        }
        pcVar5 = "orig_bary[3] not finite";
        uVar4 = 0xb84;
      }
      else {
        pcVar5 = "orig_bary[2] not finite";
        uVar4 = 0xb83;
      }
    }
    else {
      pcVar5 = "orig_bary[1] not finite";
      uVar4 = 0xb82;
    }
  }
  else {
    pcVar5 = "orig_bary[0] not finite";
    uVar4 = 0xb81;
  }
LAB_00196442:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
         "ref_node_clip_bary4",pcVar5);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_node_clip_bary4(REF_DBL *orig_bary, REF_DBL *bary) {
  REF_DBL total;

  RAS(isfinite(orig_bary[0]), "orig_bary[0] not finite");
  RAS(isfinite(orig_bary[1]), "orig_bary[1] not finite");
  RAS(isfinite(orig_bary[2]), "orig_bary[2] not finite");
  RAS(isfinite(orig_bary[3]), "orig_bary[3] not finite");

  bary[0] = MAX(0.0, orig_bary[0]);
  bary[1] = MAX(0.0, orig_bary[1]);
  bary[2] = MAX(0.0, orig_bary[2]);
  bary[3] = MAX(0.0, orig_bary[3]);

  total = bary[0] + bary[1] + bary[2] + bary[3];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total) &&
      ref_math_divisible(bary[3], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
    bary[3] /= total;
  } else {
    REF_INT i, largest;
    printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, orig_bary[0], orig_bary[1],
           orig_bary[2], orig_bary[3]);
    printf("clipped bary\n%.18e %.18e\n%.18e %.18e\n", bary[0], bary[1],
           bary[2], bary[3]);
    /* chose one node */
    largest = 0;
    for (i = 1; i < 4; i++)
      if (bary[i] > bary[largest]) largest = i;
    for (i = 0; i < 4; i++) bary[i] = 0.0;
    bary[largest] = 1.0;
    printf("modified bary\n%.18e %.18e\n%.18e %.18e\n", bary[0], bary[1],
           bary[2], bary[3]);
    return REF_DIV_ZERO;
  }

  RAS(bary[0] >= 0.0, "bary[0] not positive");
  RAS(bary[1] >= 0.0, "bary[1] not positive");
  RAS(bary[2] >= 0.0, "bary[2] not positive");
  RAS(bary[3] >= 0.0, "bary[3] not positive");

  RAS(isfinite(bary[0]), "bary[0] not finite");
  RAS(isfinite(bary[1]), "bary[1] not finite");
  RAS(isfinite(bary[2]), "bary[2] not finite");
  RAS(isfinite(bary[3]), "bary[3] not finite");

  return REF_SUCCESS;
}